

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Supermap.hpp
# Opt level: O0

optional<supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>_> * __thiscall
supermap::
Supermap<supermap::Key<1UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>,_unsigned_long>
::getValue(Supermap<supermap::Key<1UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>,_unsigned_long>
           *this,Key<1UL> *k)

{
  bool bVar1;
  int iVar2;
  pointer pEVar3;
  undefined4 extraout_var;
  unsigned_long *puVar4;
  KeyValue<supermap::Key<1UL>,_unsigned_long> *pKVar5;
  pointer pKVar6;
  optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_> *in_RDX;
  optional<supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>_> *in_RDI;
  optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_> foundOnDisk;
  optional<unsigned_long> optIndex;
  unsigned_long index;
  pointer in_stack_ffffffffffffff08;
  optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_> *in_stack_ffffffffffffff10;
  anon_class_1_0_00000001 *__f;
  function<bool_(const_supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_&,_const_supermap::Key<1UL>_&)>
  *in_stack_ffffffffffffff20;
  function<bool_(const_supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_&,_const_supermap::Key<1UL>_&)>
  *this_00;
  undefined1 local_c0 [48];
  function<bool_(const_supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_&,_const_supermap::Key<1UL>_&)>
  local_90;
  anon_class_1_0_00000001 local_68 [32];
  undefined1 local_48 [24];
  undefined8 local_30;
  unsigned_long local_20;
  optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_> *local_18;
  
  local_18 = in_RDX;
  pEVar3 = std::
           unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<1UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<1UL>,_unsigned_long,_unsigned_long>_>_>
           ::operator->((unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<1UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<1UL>,_unsigned_long,_unsigned_long>_>_>
                         *)0x12cf72);
  iVar2 = (*(pEVar3->super_KeyValueStorage<supermap::Key<1UL>,_unsigned_long,_unsigned_long>).
            _vptr_KeyValueStorage[1])(pEVar3,local_18);
  local_30 = CONCAT44(extraout_var,iVar2);
  bVar1 = std::optional<unsigned_long>::has_value((optional<unsigned_long> *)0x12cf9f);
  if (bVar1) {
    puVar4 = std::optional<unsigned_long>::value
                       ((optional<unsigned_long> *)in_stack_ffffffffffffff10);
    local_20 = *puVar4;
  }
  else {
    in_stack_ffffffffffffff08 =
         std::
         unique_ptr<supermap::SortedStoragesList<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>_>,_std::default_delete<supermap::SortedStoragesList<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>_>_>_>
         ::operator->((unique_ptr<supermap::SortedStoragesList<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>_>,_std::default_delete<supermap::SortedStoragesList<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>_>_>_>
                       *)0x12cfd0);
    __f = local_68;
    std::
    function<bool(supermap::KeyValue<supermap::Key<1ul>,unsigned_long>const&,supermap::Key<1ul>const&)>
    ::
    function<supermap::Supermap<supermap::Key<1ul>,supermap::MaybeRemovedValue<supermap::ByteArray<1ul>>,unsigned_long>::getValue(supermap::Key<1ul>const&)::_lambda(supermap::KeyValue<supermap::Key<1ul>,unsigned_long>const&,supermap::Key<1ul>const&)_1_,void>
              (in_stack_ffffffffffffff20,__f);
    this_00 = &local_90;
    std::
    function<bool(supermap::KeyValue<supermap::Key<1ul>,unsigned_long>const&,supermap::Key<1ul>const&)>
    ::
    function<supermap::Supermap<supermap::Key<1ul>,supermap::MaybeRemovedValue<supermap::ByteArray<1ul>>,unsigned_long>::getValue(supermap::Key<1ul>const&)::_lambda(supermap::KeyValue<supermap::Key<1ul>,unsigned_long>const&,supermap::Key<1ul>const&)_2_,void>
              (this_00,__f);
    (**(in_stack_ffffffffffffff08->
       super_Findable<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_supermap::Key<1UL>_>).
       _vptr_Findable)(local_48,in_stack_ffffffffffffff08,local_18,__f,this_00);
    std::
    function<bool_(const_supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_&,_const_supermap::Key<1UL>_&)>
    ::~function((function<bool_(const_supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_&,_const_supermap::Key<1UL>_&)>
                 *)0x12d03e);
    std::
    function<bool_(const_supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_&,_const_supermap::Key<1UL>_&)>
    ::~function((function<bool_(const_supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_&,_const_supermap::Key<1UL>_&)>
                 *)0x12d04b);
    bVar1 = std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>::has_value
                      ((optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_> *)0x12d058)
    ;
    if (!bVar1) {
      std::optional<supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>_>::optional(in_RDI);
      return in_RDI;
    }
    pKVar5 = std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>::value(local_18);
    local_20 = pKVar5->value;
    in_stack_ffffffffffffff10 = local_18;
  }
  pKVar6 = std::
           unique_ptr<supermap::KeyValueShrinkableStorage<supermap::Key<1UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>,_std::default_delete<supermap::KeyValueShrinkableStorage<supermap::Key<1UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>_>_>
           ::operator->((unique_ptr<supermap::KeyValueShrinkableStorage<supermap::Key<1UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>,_std::default_delete<supermap::KeyValueShrinkableStorage<supermap::Key<1UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>_>_>
                         *)0x12d0b9);
  (*(pKVar6->
    super_IndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>_>,_unsigned_long,_void>
    ).
    super_OrderedStorage<supermap::KeyValue<supermap::Key<1UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>_>,_unsigned_long,_void>
    ._vptr_OrderedStorage[4])(local_c0,pKVar6,local_20);
  std::optional<supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>_>::
  optional<supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>,_true>
            ((optional<supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>_> *)
             in_stack_ffffffffffffff10,
             (MaybeRemovedValue<supermap::ByteArray<1UL>_> *)in_stack_ffffffffffffff08);
  KeyValue<supermap::Key<1UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>_>::~KeyValue
            ((KeyValue<supermap::Key<1UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>_>
              *)0x12d0ec);
  return in_RDI;
}

Assistant:

std::optional<Value> getValue(const Key &k) override {
        IndexT index;
        if (auto optIndex = innerStorage_->getValue(k); optIndex.has_value()) {
            index = optIndex.value();
        } else {
            std::optional<KeyIndex> foundOnDisk = diskIndex_->find(
                k,
                [](const KeyIndex &ki, const Key &key) { return ki.key < key; },
                [](const KeyIndex &ki, const Key &key) { return ki.key == key; }
            );
            if (!foundOnDisk.has_value()) {
                return std::nullopt;
            }
            index = foundOnDisk.value().value;
        }
        return std::optional{diskDataStorage_->get(index).value};
    }